

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiID id;
  uint *puVar4;
  uint in_EDI;
  ImGuiWindow *tooltip_window;
  ImGuiPayload *payload;
  bool is_hovered;
  ImGuiMouseButton mouse_button;
  ImGuiID source_parent_id;
  ImGuiID source_id;
  bool source_drag_active;
  ImGuiWindow *window;
  ImGuiContext *g;
  float in_stack_ffffffffffffffbc;
  ImGuiMouseButton button;
  undefined8 in_stack_ffffffffffffffc0;
  ImRect *in_stack_ffffffffffffffc8;
  int iVar5;
  ImGuiID IVar6;
  uint3 in_stack_ffffffffffffffe4;
  uint uVar7;
  ImGuiWindow *local_18;
  bool local_1;
  
  pIVar2 = GImGui;
  local_18 = GImGui->CurrentWindow;
  uVar7 = (uint)in_stack_ffffffffffffffe4;
  IVar6 = 0;
  iVar5 = 0;
  if ((in_EDI & 0x10) == 0) {
    id = (local_18->DC).LastItemId;
    if ((id != 0) && (GImGui->ActiveId != id)) {
      return false;
    }
    if (((GImGui->IO).MouseDown[0] & 1U) == 0) {
      return false;
    }
    if (id == 0) {
      if ((in_EDI & 8) == 0) {
        return false;
      }
      if ((((local_18->DC).LastItemStatusFlags & 1U) == 0) &&
         ((GImGui->ActiveId == 0 || (GImGui->ActiveIdWindow != local_18)))) {
        return false;
      }
      id = ImGuiWindow::GetIDFromRectangle
                     ((ImGuiWindow *)((ulong)in_stack_ffffffffffffffe4 << 0x20),(ImRect *)0x0);
      (local_18->DC).LastItemId = id;
      bVar3 = ItemHoverable(in_stack_ffffffffffffffc8,
                            (ImGuiID)((ulong)in_stack_ffffffffffffffc0 >> 0x20));
      if ((bVar3) && (((pIVar2->IO).MouseClicked[iVar5] & 1U) != 0)) {
        SetActiveID(id,local_18);
        FocusWindow((ImGuiWindow *)CONCAT44(uVar7,id));
      }
      if (pIVar2->ActiveId == id) {
        pIVar2->ActiveIdAllowOverlap = bVar3;
      }
    }
    else {
      GImGui->ActiveIdAllowOverlap = false;
    }
    button = (ImGuiMouseButton)in_stack_ffffffffffffffc0;
    if (pIVar2->ActiveId != id) {
      return false;
    }
    puVar4 = ImVector<unsigned_int>::back(&local_18->IDStack);
    IVar6 = *puVar4;
    bVar3 = IsMouseDragging(button,in_stack_ffffffffffffffbc);
    pIVar2->ActiveIdUsingNavDirMask = 0xffffffff;
    pIVar2->ActiveIdUsingNavInputMask = 0xffffffff;
    pIVar2->ActiveIdUsingKeyInputMask = 0xffffffffffffffff;
  }
  else {
    local_18 = (ImGuiWindow *)0x0;
    id = ImHashStr("#SourceExtern",0,0);
    bVar3 = true;
  }
  if (bVar3 == false) {
    local_1 = false;
  }
  else {
    if ((pIVar2->DragDropActive & 1U) == 0) {
      ClearDragDrop();
      (pIVar2->DragDropPayload).SourceId = id;
      (pIVar2->DragDropPayload).SourceParentId = IVar6;
      pIVar2->DragDropActive = true;
      pIVar2->DragDropSourceFlags = in_EDI;
      pIVar2->DragDropMouseButton = iVar5;
      if ((pIVar2->DragDropPayload).SourceId == pIVar2->ActiveId) {
        pIVar2->ActiveIdNoClearOnFocusLoss = true;
      }
    }
    pIVar2->DragDropSourceFrameCount = pIVar2->FrameCount;
    pIVar2->DragDropWithinSource = true;
    if ((((in_EDI & 1) == 0) && (BeginTooltip(), pIVar2->DragDropAcceptIdPrev != 0)) &&
       ((pIVar2->DragDropAcceptFlags & 0x1000U) != 0)) {
      pIVar1 = pIVar2->CurrentWindow;
      pIVar1->SkipItems = true;
      pIVar1->HiddenFramesCanSkipItems = 1;
    }
    if (((in_EDI & 2) == 0) && ((in_EDI & 0x10) == 0)) {
      (local_18->DC).LastItemStatusFlags = (local_18->DC).LastItemStatusFlags & 0xfffffffe;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropSource(ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    bool source_drag_active = false;
    ImGuiID source_id = 0;
    ImGuiID source_parent_id = 0;
    ImGuiMouseButton mouse_button = ImGuiMouseButton_Left;
    if (!(flags & ImGuiDragDropFlags_SourceExtern))
    {
        source_id = window->DC.LastItemId;
        if (source_id != 0 && g.ActiveId != source_id) // Early out for most common case
            return false;
        if (g.IO.MouseDown[mouse_button] == false)
            return false;

        if (source_id == 0)
        {
            // If you want to use BeginDragDropSource() on an item with no unique identifier for interaction, such as Text() or Image(), you need to:
            // A) Read the explanation below, B) Use the ImGuiDragDropFlags_SourceAllowNullID flag, C) Swallow your programmer pride.
            if (!(flags & ImGuiDragDropFlags_SourceAllowNullID))
            {
                IM_ASSERT(0);
                return false;
            }

            // Early out
            if ((window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect) == 0 && (g.ActiveId == 0 || g.ActiveIdWindow != window))
                return false;

            // Magic fallback (=somehow reprehensible) to handle items with no assigned ID, e.g. Text(), Image()
            // We build a throwaway ID based on current ID stack + relative AABB of items in window.
            // THE IDENTIFIER WON'T SURVIVE ANY REPOSITIONING OF THE WIDGET, so if your widget moves your dragging operation will be canceled.
            // We don't need to maintain/call ClearActiveID() as releasing the button will early out this function and trigger !ActiveIdIsAlive.
            source_id = window->DC.LastItemId = window->GetIDFromRectangle(window->DC.LastItemRect);
            bool is_hovered = ItemHoverable(window->DC.LastItemRect, source_id);
            if (is_hovered && g.IO.MouseClicked[mouse_button])
            {
                SetActiveID(source_id, window);
                FocusWindow(window);
            }
            if (g.ActiveId == source_id) // Allow the underlying widget to display/return hovered during the mouse release frame, else we would get a flicker.
                g.ActiveIdAllowOverlap = is_hovered;
        }
        else
        {
            g.ActiveIdAllowOverlap = false;
        }
        if (g.ActiveId != source_id)
            return false;
        source_parent_id = window->IDStack.back();
        source_drag_active = IsMouseDragging(mouse_button);

        // Disable navigation and key inputs while dragging
        g.ActiveIdUsingNavDirMask = ~(ImU32)0;
        g.ActiveIdUsingNavInputMask = ~(ImU32)0;
        g.ActiveIdUsingKeyInputMask = ~(ImU64)0;
    }
    else
    {
        window = NULL;
        source_id = ImHashStr("#SourceExtern");
        source_drag_active = true;
    }

    if (source_drag_active)
    {
        if (!g.DragDropActive)
        {
            IM_ASSERT(source_id != 0);
            ClearDragDrop();
            ImGuiPayload& payload = g.DragDropPayload;
            payload.SourceId = source_id;
            payload.SourceParentId = source_parent_id;
            g.DragDropActive = true;
            g.DragDropSourceFlags = flags;
            g.DragDropMouseButton = mouse_button;
            if (payload.SourceId == g.ActiveId)
                g.ActiveIdNoClearOnFocusLoss = true;
        }
        g.DragDropSourceFrameCount = g.FrameCount;
        g.DragDropWithinSource = true;

        if (!(flags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        {
            // Target can request the Source to not display its tooltip (we use a dedicated flag to make this request explicit)
            // We unfortunately can't just modify the source flags and skip the call to BeginTooltip, as caller may be emitting contents.
            BeginTooltip();
            if (g.DragDropAcceptIdPrev && (g.DragDropAcceptFlags & ImGuiDragDropFlags_AcceptNoPreviewTooltip))
            {
                ImGuiWindow* tooltip_window = g.CurrentWindow;
                tooltip_window->SkipItems = true;
                tooltip_window->HiddenFramesCanSkipItems = 1;
            }
        }

        if (!(flags & ImGuiDragDropFlags_SourceNoDisableHover) && !(flags & ImGuiDragDropFlags_SourceExtern))
            window->DC.LastItemStatusFlags &= ~ImGuiItemStatusFlags_HoveredRect;

        return true;
    }
    return false;
}